

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O3

int atomuse(stmt *s)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = s->code;
  uVar2 = 0xffffffff;
  if (uVar1 != 0xffffffff) {
    switch(uVar1 & 7) {
    default:
      if (((byte)uVar1 & 0xe0) == 0x40) {
        return 0x11;
      }
      if ((uVar1 & 0xe0) == 0x60) {
        return s->k;
      }
      break;
    case 2:
      return 0x10;
    case 3:
      return 0x11;
    case 4:
    case 5:
      return (uVar1 & 8) >> 2 | 0x10;
    case 6:
      uVar2 = -(uint)((uVar1 & 0x18) != 8) | 0x11;
      if ((uVar1 & 0x18) == 0x10) {
        uVar2 = 0x10;
      }
      return uVar2;
    case 7:
      uVar2 = (uVar1 & 0xf8) == 0x80 | 0x10;
    }
  }
  return uVar2;
}

Assistant:

static int
atomuse(struct stmt *s)
{
	register int c = s->code;

	if (c == NOP)
		return -1;

	switch (BPF_CLASS(c)) {

	case BPF_RET:
		return (BPF_RVAL(c) == BPF_A) ? A_ATOM :
			(BPF_RVAL(c) == BPF_X) ? X_ATOM : -1;

	case BPF_LD:
	case BPF_LDX:
		return (BPF_MODE(c) == BPF_IND) ? X_ATOM :
			(BPF_MODE(c) == BPF_MEM) ? s->k : -1;

	case BPF_ST:
		return A_ATOM;

	case BPF_STX:
		return X_ATOM;

	case BPF_JMP:
	case BPF_ALU:
		if (BPF_SRC(c) == BPF_X)
			return AX_ATOM;
		return A_ATOM;

	case BPF_MISC:
		return BPF_MISCOP(c) == BPF_TXA ? X_ATOM : A_ATOM;
	}
	abort();
	/* NOTREACHED */
}